

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

char * stb__reg_parse(stb_matcher *matcher,int start,char *regex,stb_uint16 *end)

{
  uint uVar1;
  char *pcVar2;
  stb_uint32 *psVar3;
  bool bVar4;
  int local_174;
  int i_3;
  uint f;
  int k [2];
  int i_2;
  int i_1;
  stb_uint b;
  stb_uint i;
  stb_uint a;
  int z;
  int invert;
  stb_uint8 flags [256];
  ushort local_3a;
  uint local_38;
  int iStack_34;
  stb_uint16 last_end;
  int last_start;
  int n;
  stb_uint16 *end_local;
  char *regex_local;
  stb_matcher *psStack_18;
  int start_local;
  stb_matcher *matcher_local;
  
  local_38 = 0xffffffff;
  local_3a = (ushort)start;
  _last_start = end;
  end_local = (stb_uint16 *)regex;
  regex_local._4_4_ = start;
  psStack_18 = matcher;
  do {
    if ((char)*end_local == '\0') {
      *_last_start = local_3a;
      return (char *)end_local;
    }
    switch((char)*end_local) {
    case '$':
      iStack_34 = stb__add_node(psStack_18);
      stb__add_edge(psStack_18,(uint)local_3a,iStack_34,10);
      local_38 = (uint)local_3a;
      local_3a = (ushort)iStack_34;
      end_local = (stb_uint16 *)((long)end_local + 1);
      break;
    case '(':
      local_38 = (uint)local_3a;
      pcVar2 = stb__reg_parse_alt(psStack_18,(uint)local_3a,(char *)((long)end_local + 1),&local_3a)
      ;
      if ((pcVar2 == (char *)0x0) || (*pcVar2 != ')')) {
        return (char *)0x0;
      }
      end_local = (stb_uint16 *)(pcVar2 + 1);
      break;
    case ')':
    case '|':
      *_last_start = local_3a;
      return (char *)end_local;
    case '*':
      if ((int)local_38 < 0) {
        return (char *)0x0;
      }
      stb__add_epsilon(psStack_18,local_38,(uint)local_3a);
    case '+':
      if ((int)local_38 < 0) {
        return (char *)0x0;
      }
      stb__add_epsilon(psStack_18,(uint)local_3a,local_38);
      iStack_34 = stb__add_node(psStack_18);
      stb__add_epsilon(psStack_18,(uint)local_3a,iStack_34);
      local_3a = (ushort)iStack_34;
      end_local = (stb_uint16 *)((long)end_local + 1);
      break;
    case '.':
      iStack_34 = stb__add_node(psStack_18);
      stb__add_edge(psStack_18,(uint)local_3a,iStack_34,-1);
      local_38 = (uint)local_3a;
      local_3a = (ushort)iStack_34;
      end_local = (stb_uint16 *)((long)end_local + 1);
      break;
    case '?':
      if ((int)local_38 < 0) {
        return (char *)0x0;
      }
      stb__add_epsilon(psStack_18,local_38,(uint)local_3a);
      end_local = (stb_uint16 *)((long)end_local + 1);
      break;
    case '[':
      end_local = (stb_uint16 *)((long)end_local + 1);
      if (psStack_18->num_charset == 0) {
        psVar3 = (stb_uint32 *)stb_malloc(psStack_18,0x400);
        psStack_18->charset = psVar3;
        memset(psStack_18->charset,0,0x400);
      }
      memset(&z,0,0x100);
      bVar4 = (char)*end_local == '^';
      if (bVar4) {
        end_local = (stb_uint16 *)((long)end_local + 1);
      }
      if ((char)*end_local == ']') {
        flags[0x55] = '\x01';
        end_local = (stb_uint16 *)((long)end_local + 1);
      }
      while ((char)*end_local != ']') {
        if ((char)*end_local == '\0') {
          return (char *)0x0;
        }
        i_1 = (int)(char)*end_local;
        if ((*(char *)((long)end_local + 1) == '-') && ((char)end_local[1] != ']')) {
          uVar1 = (uint)(char)end_local[1];
          end_local = (stb_uint16 *)((long)end_local + 3);
          if (uVar1 == 0) {
            return (char *)0x0;
          }
          if (uVar1 < (uint)i_1) {
            return (char *)0x0;
          }
          for (; (uint)i_1 <= uVar1; i_1 = i_1 + 1) {
            *(undefined1 *)((long)&z + (ulong)(uint)i_1) = 1;
          }
        }
        else {
          end_local = (stb_uint16 *)((long)end_local + 1);
          *(undefined1 *)((long)&z + (ulong)(uint)i_1) = 1;
        }
      }
      end_local = (stb_uint16 *)((long)end_local + 1);
      if (bVar4) {
        for (k[1] = 0; k[1] < 0x100; k[1] = k[1] + 1) {
          *(char *)((long)&z + (long)k[1]) = '\x01' - *(char *)((long)&z + (long)k[1]);
        }
      }
      for (i = 0; (int)i < psStack_18->num_charset; i = i + 1) {
        i_3 = 0;
        f = 1 << ((byte)i & 0x1f);
        k[0] = 0;
        while ((k[0] < 0x100 &&
               ((psStack_18->charset[k[0]] & f) == (&i_3)[*(byte *)((long)&z + (long)k[0])]))) {
          k[0] = k[0] + 1;
        }
        if (k[0] == 0x100) break;
      }
      if (i == psStack_18->num_charset) {
        psStack_18->num_charset = psStack_18->num_charset + 1;
        if (0x20 < psStack_18->num_charset) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0x2429,"char *stb__reg_parse(stb_matcher *, int, char *, stb_uint16 *)");
        }
        for (local_174 = 0; local_174 < 0x100; local_174 = local_174 + 1) {
          if (*(char *)((long)&z + (long)local_174) != '\0') {
            psStack_18->charset[local_174] = 1 << ((byte)i & 0x1f) | psStack_18->charset[local_174];
          }
        }
      }
      iStack_34 = stb__add_node(psStack_18);
      stb__add_edge(psStack_18,(uint)local_3a,iStack_34,-2 - i);
      local_38 = (uint)local_3a;
      local_3a = (ushort)iStack_34;
      break;
    case '\\':
      end_local = (stb_uint16 *)((long)end_local + 1);
      if (*(char *)end_local == '\0') {
        return (char *)0x0;
      }
    default:
      iStack_34 = stb__add_node(psStack_18);
      stb__add_edge(psStack_18,(uint)local_3a,iStack_34,(int)(char)*end_local);
      local_38 = (uint)local_3a;
      local_3a = (ushort)iStack_34;
      end_local = (stb_uint16 *)((long)end_local + 1);
      break;
    case '{':
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

static char *stb__reg_parse(stb_matcher *matcher, int start, char *regex, stb_uint16 *end)
{
   int n;
   int last_start = -1;
   stb_uint16 last_end = start;

   while (*regex) {
      switch (*regex) {
         case '(':
            last_start = last_end;
            regex = stb__reg_parse_alt(matcher, last_end, regex+1, &last_end);
            if (regex == NULL || *regex != ')')
               return NULL;
            ++regex;
            break;

         case '|':
         case ')':
            *end = last_end;
            return regex;

         case '?':
            if (last_start < 0) return NULL;
            stb__add_epsilon(matcher, last_start, last_end);
            ++regex;
            break;

         case '*':
            if (last_start < 0) return NULL;
            stb__add_epsilon(matcher, last_start, last_end);

            // fall through

         case '+':
            if (last_start < 0) return NULL;
            stb__add_epsilon(matcher, last_end, last_start);
            // prevent links back to last_end from chaining to last_start
            n = stb__add_node(matcher);
            stb__add_epsilon(matcher, last_end, n);
            last_end = n;
            ++regex;
            break;

         case '{':   // not supported!
            // @TODO: given {n,m}, clone last_start to last_end m times,
            // and include epsilons from start to first m-n blocks
            return NULL; 

         case '\\':
            ++regex;
            if (!*regex) return NULL;

            // fallthrough
         default: // match exactly this character
            n = stb__add_node(matcher);
            stb__add_edge(matcher, last_end, n, *regex);
            last_start = last_end;
            last_end = n;
            ++regex;
            break;

         case '$':
            n = stb__add_node(matcher);
            stb__add_edge(matcher, last_end, n, '\n');
            last_start = last_end;
            last_end = n;
            ++regex;
            break;

         case '.':
            n = stb__add_node(matcher);
            stb__add_edge(matcher, last_end, n, -1);
            last_start = last_end;
            last_end = n;
            ++regex;
            break;

         case '[': {
            stb_uint8 flags[256];
            int invert = 0,z;
            ++regex;
            if (matcher->num_charset == 0) {
               matcher->charset = (stb_uint *) stb_malloc(matcher, sizeof(*matcher->charset) * 256);
               memset(matcher->charset, 0, sizeof(*matcher->charset) * 256);
            }

            memset(flags,0,sizeof(flags));

            // leading ^ is special
            if (*regex == '^')
               ++regex, invert = 1;

            // leading ] is special
            if (*regex == ']') {
               flags[']'] = 1;
               ++regex;
            }
            while (*regex != ']') {
               stb_uint a;
               if (!*regex) return NULL;
               a = *regex++;
               if (regex[0] == '-' && regex[1] != ']') {
                  stb_uint i,b = regex[1];
                  regex += 2;
                  if (b == 0) return NULL;
                  if (a > b) return NULL;
                  for (i=a; i <= b; ++i)
                     flags[i] = 1;
               } else
                  flags[a] = 1;
            }
            ++regex;
            if (invert) {
               int i;
               for (i=0; i < 256; ++i)
                  flags[i] = 1-flags[i];
            }

            // now check if any existing charset matches
            for (z=0; z < matcher->num_charset; ++z) {
               int i, k[2] = { 0, 1 << z};
               for (i=0; i < 256; ++i) {
                  unsigned int f = k[flags[i]];
                  if ((matcher->charset[i] & k[1]) != f)
                     break;
               }
               if (i == 256) break;
            }

            if (z == matcher->num_charset) {
               int i;
               ++matcher->num_charset;
               if (matcher->num_charset > 32) {
                  assert(0); /* NOTREACHED */
                  return NULL; // too many charsets, oops
               }
               for (i=0; i < 256; ++i)
                  if (flags[i])
                     matcher->charset[i] |= (1 << z);
            }

            n = stb__add_node(matcher);
            stb__add_edge(matcher, last_end, n, -2 - z);
            last_start = last_end;
            last_end = n;
            break;
         }
      }
   }
   *end = last_end;
   return regex;
}